

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

Result<wallet::SelectionResult> *
wallet::SelectCoinsSRD
          (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount target_value,CAmount change_fee,FastRandomContext *rng,int max_selection_weight)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  iterator __first;
  iterator __last;
  const_reference pvVar4;
  CAmount CVar5;
  const_reference pvVar6;
  long in_RCX;
  long in_RDX;
  FastRandomContext *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  OutputGroup *to_remove_group;
  OutputGroup *group;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  bool max_tx_weight_exceeded;
  int weight;
  CAmount selected_eff_value;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indexes;
  priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
  heap;
  SelectionResult result;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd80;
  Error *error;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd88;
  value_type *in_stack_fffffffffffffd90;
  undefined5 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9d;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  FastRandomContext *__g;
  int local_1e4;
  long local_1e0;
  Error local_148;
  SelectionResult local_108 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __g = in_RDI;
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffffd88._M_current,
             (CAmount)in_stack_fffffffffffffd80._M_current,
             (SelectionAlgorithm)((uint)in_stack_fffffffffffffd7c >> 0x18));
  std::
  priority_queue<wallet::OutputGroup,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>,wallet::MinOutputGroupComparator>
  ::priority_queue<std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>,void>
            ((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffd9f,
                      CONCAT16(in_stack_fffffffffffffd9e,
                               CONCAT15(in_stack_fffffffffffffd9d,in_stack_fffffffffffffd98))),
             (size_type)in_stack_fffffffffffffd90);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffd80._M_current);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      (in_stack_fffffffffffffd80._M_current);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_fffffffffffffd80._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffd80._M_current);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,FastRandomContext&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current,__g);
  local_1e0 = 0;
  local_1e4 = 0;
  bVar1 = false;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffd80._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffd80._M_current);
  while (bVar2 = __gnu_cxx::
                 operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffd88._M_current,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffd80._M_current), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    pvVar4 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                       ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                        in_stack_fffffffffffffd88._M_current,
                        (size_type)in_stack_fffffffffffffd80._M_current);
    OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffd88._M_current);
    inline_assertion_check<false,bool>
              ((bool *)CONCAT17(in_stack_fffffffffffffd9f,
                                CONCAT16(in_stack_fffffffffffffd9e,
                                         CONCAT15(in_stack_fffffffffffffd9d,
                                                  in_stack_fffffffffffffd98))),
               (char *)in_stack_fffffffffffffd90,
               (int)((ulong)in_stack_fffffffffffffd88._M_current >> 0x20),
               (char *)in_stack_fffffffffffffd80._M_current,
               (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::
    priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
    ::push((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
            *)CONCAT17(in_stack_fffffffffffffd9f,
                       CONCAT16(in_stack_fffffffffffffd9e,
                                CONCAT15(in_stack_fffffffffffffd9d,in_stack_fffffffffffffd98))),
           in_stack_fffffffffffffd90);
    CVar5 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffd88._M_current);
    local_1e0 = CVar5 + local_1e0;
    local_1e4 = pvVar4->m_weight + local_1e4;
    if (in_R9D < local_1e4) {
      bVar1 = true;
      do {
        pvVar6 = std::
                 priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
                 ::top((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
                        *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        CVar5 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffd88._M_current)
        ;
        local_1e0 = local_1e0 - CVar5;
        local_1e4 = local_1e4 - pvVar6->m_weight;
        std::
        priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
        ::pop((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
               *)CONCAT17(in_stack_fffffffffffffd9f,
                          CONCAT16(in_stack_fffffffffffffd9e,
                                   CONCAT15(in_stack_fffffffffffffd9d,in_stack_fffffffffffffd98))));
        in_stack_fffffffffffffd9f =
             std::
             priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
             ::empty((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
                      *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        in_stack_fffffffffffffd9e = !(bool)in_stack_fffffffffffffd9f && in_R9D < local_1e4;
      } while ((bool)in_stack_fffffffffffffd9e);
    }
    if (in_RCX + 50000 + in_RDX <= local_1e0) goto LAB_00bb063e;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
  if (bVar1) {
    ErrorMaxWeightExceeded();
  }
  else {
    local_148.message.translated.field_2._M_allocated_capacity = 0;
    local_148.message.translated.field_2._8_8_ = 0;
    local_148.message.translated._M_dataplus._M_p = (pointer)0x0;
    local_148.message.translated._M_string_length = 0;
    local_148.message.original.field_2._M_allocated_capacity = 0;
    local_148.message.original.field_2._8_8_ = 0;
    local_148.message.original._M_dataplus._M_p = (pointer)0x0;
    local_148.message.original._M_string_length = 0;
    error = &local_148;
    util::Error::Error((Error *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    util::Result<wallet::SelectionResult>::Result
              ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffd88._M_current,error);
    util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
LAB_00bb07d4:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffd88._M_current);
  std::
  priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
  ::~priority_queue((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
                     *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SelectionResult::~SelectionResult
            ((SelectionResult *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Result<wallet::SelectionResult> *)in_RDI;
LAB_00bb063e:
  while (uVar3 = std::
                 priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
                 ::empty((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
                          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)),
        ((uVar3 ^ 0xff) & 1) != 0) {
    std::
    priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
    ::top((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
           *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    SelectionResult::AddInput
              ((SelectionResult *)in_stack_fffffffffffffd88._M_current,
               (OutputGroup *)in_stack_fffffffffffffd80._M_current);
    std::
    priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
    ::pop((priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
           *)CONCAT17(in_stack_fffffffffffffd9f,
                      CONCAT16(in_stack_fffffffffffffd9e,CONCAT15(uVar3,in_stack_fffffffffffffd98)))
         );
  }
  in_stack_fffffffffffffd88._M_current = (unsigned_long *)local_108;
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffffd88._M_current,
             (SelectionResult *)in_stack_fffffffffffffd80._M_current);
  util::Result<wallet::SelectionResult>::Result
            ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffd88._M_current,
             (T *)in_stack_fffffffffffffd80._M_current);
  SelectionResult::~SelectionResult
            ((SelectionResult *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  goto LAB_00bb07d4;
}

Assistant:

util::Result<SelectionResult> SelectCoinsSRD(const std::vector<OutputGroup>& utxo_pool, CAmount target_value, CAmount change_fee, FastRandomContext& rng,
                                             int max_selection_weight)
{
    SelectionResult result(target_value, SelectionAlgorithm::SRD);
    std::priority_queue<OutputGroup, std::vector<OutputGroup>, MinOutputGroupComparator> heap;

    // Include change for SRD as we want to avoid making really small change if the selection just
    // barely meets the target. Just use the lower bound change target instead of the randomly
    // generated one, since SRD will result in a random change amount anyway; avoid making the
    // target needlessly large.
    target_value += CHANGE_LOWER + change_fee;

    std::vector<size_t> indexes;
    indexes.resize(utxo_pool.size());
    std::iota(indexes.begin(), indexes.end(), 0);
    std::shuffle(indexes.begin(), indexes.end(), rng);

    CAmount selected_eff_value = 0;
    int weight = 0;
    bool max_tx_weight_exceeded = false;
    for (const size_t i : indexes) {
        const OutputGroup& group = utxo_pool.at(i);
        Assume(group.GetSelectionAmount() > 0);

        // Add group to selection
        heap.push(group);
        selected_eff_value += group.GetSelectionAmount();
        weight += group.m_weight;

        // If the selection weight exceeds the maximum allowed size, remove the least valuable inputs until we
        // are below max weight.
        if (weight > max_selection_weight) {
            max_tx_weight_exceeded = true; // mark it in case we don't find any useful result.
            do {
                const OutputGroup& to_remove_group = heap.top();
                selected_eff_value -= to_remove_group.GetSelectionAmount();
                weight -= to_remove_group.m_weight;
                heap.pop();
            } while (!heap.empty() && weight > max_selection_weight);
        }

        // Now check if we are above the target
        if (selected_eff_value >= target_value) {
            // Result found, add it.
            while (!heap.empty()) {
                result.AddInput(heap.top());
                heap.pop();
            }
            return result;
        }
    }
    return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
}